

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

uint32_t __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<6>::GetAxis
          (DynamicIntegerPointsKdTreeDecoder<6> *this,uint32_t num_remaining_points,
          VectorUint32 *levels,uint32_t last_axis)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t local_c;
  
  local_c = 0;
  if (num_remaining_points < 0x40) {
    local_c = 0;
    if (1 < (ulong)this->dimension_) {
      puVar1 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar2 = uVar3 & 0xffffffff;
        if (puVar1[uVar4] <= puVar1[uVar3]) {
          uVar2 = uVar4;
        }
        uVar3 = uVar3 + 1;
        local_c = (uint32_t)uVar2;
        uVar4 = uVar2;
      } while (this->dimension_ != uVar3);
    }
  }
  else {
    DirectBitDecoder::DecodeLeastSignificantBits32(&this->axis_decoder_,4,&local_c);
  }
  return local_c;
}

Assistant:

uint32_t DynamicIntegerPointsKdTreeDecoder<compression_level_t>::GetAxis(
    uint32_t num_remaining_points, const VectorUint32 &levels,
    uint32_t last_axis) {
  if (!Policy::select_axis) {
    return DRACO_INCREMENT_MOD(last_axis, dimension_);
  }

  uint32_t best_axis = 0;
  if (num_remaining_points < 64) {
    for (uint32_t axis = 1; axis < dimension_; ++axis) {
      if (levels[best_axis] > levels[axis]) {
        best_axis = axis;
      }
    }
  } else {
    axis_decoder_.DecodeLeastSignificantBits32(4, &best_axis);
  }

  return best_axis;
}